

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O1

ssize_t amqp_tcp_socket_recv(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  ssize_t sVar2;
  
  do {
    sVar2 = recv(*(int *)((long)base + 8),buf,len,flags);
    if (-1 < sVar2) {
      if (sVar2 != 0) {
        return sVar2;
      }
      return -7;
    }
    iVar1 = amqp_os_socket_error();
    *(int *)((long)base + 0x20) = iVar1;
  } while (iVar1 == 4);
  return -9;
}

Assistant:

static ssize_t
amqp_tcp_socket_recv(void *base, void *buf, size_t len, int flags)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t ret;

start:
  ret = recv(self->sockfd, buf, len, flags);

  if (0 > ret) {
    self->internal_error = amqp_os_socket_error();
    if (EINTR == self->internal_error) {
      goto start;
    } else {
      ret = AMQP_STATUS_SOCKET_ERROR;
    }
  } else if (0 == ret) {
    ret = AMQP_STATUS_CONNECTION_CLOSED;
  }

  return ret;
}